

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O0

bool crnlib::dxt_fast::determine_selectors
               (uint n,color_quad_u8 *block,uint min16,uint max16,uint8 *pSelectors)

{
  color_quad<unsigned_char,_int> *local_40;
  color_quad<unsigned_char,_int> local_38 [2];
  color_quad_u8 color [4];
  uint8 *pSelectors_local;
  uint max16_local;
  uint min16_local;
  color_quad_u8 *block_local;
  uint n_local;
  
  local_40 = local_38;
  color._8_8_ = pSelectors;
  do {
    color_quad<unsigned_char,_int>::color_quad(local_40);
    local_40 = local_40 + 1;
  } while (local_40 != color + 2);
  if (max16 == min16) {
    memset((void *)color._8_8_,0,(ulong)n);
    block_local._7_1_ = false;
  }
  else {
    eval_colors(local_38,min16,max16);
    block_local._7_1_ = match_block_colors(n,block,local_38,(uint8 *)color._8_8_);
  }
  return block_local._7_1_;
}

Assistant:

static bool determine_selectors(uint n, const color_quad_u8* block, uint min16, uint max16, uint8* pSelectors)
        {
            color_quad_u8 color[4];

            if (max16 != min16)
            {
                eval_colors(color, min16, max16);

                return match_block_colors(n, block, color, pSelectors);
            }

            memset(pSelectors, 0, n);
            return false;
        }